

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::GatherBase::VerifyCompute(GatherBase *this)

{
  float fVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  ulong uVar5;
  ulong uVar6;
  float afStack_c [3];
  
  pfVar4 = (float *)glu::CallLogWrapper::glMapBufferRange
                              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.
                                super_CallLogWrapper,0x90d2,0,0x10,1);
  afStack_c[1] = 0.0;
  afStack_c[2] = 1.0;
  fVar1 = *pfVar4;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    uVar5 = 0xffffffffffffffff;
    while (uVar5 != 2) {
      lVar2 = uVar5 + 2;
      uVar6 = uVar5 + 1;
      lVar3 = uVar5 + 1;
      if ((pfVar4[lVar2] != afStack_c[lVar3]) ||
         (uVar5 = uVar6, NAN(pfVar4[lVar2]) || NAN(afStack_c[lVar3]))) goto LAB_00c0fd3f;
    }
    uVar6 = 3;
LAB_00c0fd3f:
    if (2 < uVar6) {
      return 0;
    }
  }
  anon_unknown_0::Output
            ("Expected Vec4(0, 1, 0, 1), got: %f, %f, %f, %f",SUB84((double)fVar1,0),
             (double)pfVar4[1],(double)pfVar4[2],(double)pfVar4[3]);
  return -1;
}

Assistant:

virtual long VerifyCompute()
	{
		Vec4* data;
		data = static_cast<Vec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(Vec4), GL_MAP_READ_BIT));
		if (data[0] != Vec4(0, 1, 0, 1))
		{
			Output("Expected Vec4(0, 1, 0, 1), got: %f, %f, %f, %f", data[0].x(), data[0].y(), data[0].z(),
				   data[0].w());
			return ERROR;
		}
		return NO_ERROR;
	}